

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerHeader.h
# Opt level: O3

void __thiscall
DIS::IffAtcNavAidsLayer2Pdu::setLayerHeader(IffAtcNavAidsLayer2Pdu *this,LayerHeader *pX)

{
  uchar uVar1;
  unsigned_short uVar2;
  
  uVar1 = pX->_layerSpecificInformaiton;
  uVar2 = pX->_length;
  (this->_layerHeader)._layerNumber = pX->_layerNumber;
  (this->_layerHeader)._layerSpecificInformaiton = uVar1;
  (this->_layerHeader)._length = uVar2;
  return;
}

Assistant:

class OPENDIS6_EXPORT LayerHeader
{
protected:
  /** Layer number */
  unsigned char _layerNumber; 

  /** Layer speccific information enumeration */
  unsigned char _layerSpecificInformaiton; 

  /** information length */
  unsigned short _length; 


 public:
    LayerHeader();
    virtual ~LayerHeader();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    unsigned char getLayerNumber() const; 
    void setLayerNumber(unsigned char pX); 

    unsigned char getLayerSpecificInformaiton() const; 
    void setLayerSpecificInformaiton(unsigned char pX); 

    unsigned short getLength() const; 
    void setLength(unsigned short pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const LayerHeader& rhs) const;
}